

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O2

void __thiscall OpenMD::ForceMatrixDecomposition::zeroWorkArrays(ForceMatrixDecomposition *this)

{
  Snapshot *pSVar1;
  pointer pdVar2;
  uint uVar3;
  pointer pdVar4;
  double local_58;
  Vector<double,_7U> local_50;
  
  local_58 = 0.0;
  Vector<double,_7U>::Vector(&local_50,&local_58);
  Vector<double,_7U>::operator=(&(this->super_ForceDecomposition).pairwisePot,&local_50);
  local_58 = 0.0;
  Vector<double,_7U>::Vector(&local_50,&local_58);
  Vector<double,_7U>::operator=(&(this->super_ForceDecomposition).selfPot,&local_50);
  local_58 = 0.0;
  Vector<double,_7U>::Vector(&local_50,&local_58);
  Vector<double,_7U>::operator=(&(this->super_ForceDecomposition).excludedPot,&local_50);
  local_58 = 0.0;
  Vector<double,_7U>::Vector(&local_50,&local_58);
  Vector<double,_7U>::operator=(&(this->super_ForceDecomposition).excludedSelfPot,&local_50);
  local_58 = 0.0;
  Vector<double,_7U>::Vector(&local_50,&local_58);
  Vector<double,_7U>::operator=(&(this->super_ForceDecomposition).selectedPot,&local_50);
  local_58 = 0.0;
  Vector<double,_7U>::Vector(&local_50,&local_58);
  Vector<double,_7U>::operator=(&(this->super_ForceDecomposition).selectedSelfPot,&local_50);
  uVar3 = (this->super_ForceDecomposition).atomStorageLayout_;
  if ((uVar3 & 0x40) != 0) {
    pSVar1 = (this->super_ForceDecomposition).snap_;
    pdVar2 = (pSVar1->atomData).particlePot.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pdVar4 = (pSVar1->atomData).particlePot.super__Vector_base<double,_std::allocator<double>_>
                  ._M_impl.super__Vector_impl_data._M_start; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1)
    {
      *pdVar4 = 0.0;
    }
  }
  if ((char)uVar3 < '\0') {
    pSVar1 = (this->super_ForceDecomposition).snap_;
    pdVar2 = (pSVar1->atomData).density.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar4 = (pSVar1->atomData).density.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
      *pdVar4 = 0.0;
    }
  }
  if ((uVar3 >> 8 & 1) != 0) {
    pSVar1 = (this->super_ForceDecomposition).snap_;
    pdVar2 = (pSVar1->atomData).functional.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pdVar4 = (pSVar1->atomData).functional.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
      *pdVar4 = 0.0;
    }
  }
  if ((uVar3 >> 9 & 1) != 0) {
    pSVar1 = (this->super_ForceDecomposition).snap_;
    pdVar2 = (pSVar1->atomData).functionalDerivative.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    for (pdVar4 = (pSVar1->atomData).functionalDerivative.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
      *pdVar4 = 0.0;
    }
  }
  if ((uVar3 >> 0xd & 1) != 0) {
    pSVar1 = (this->super_ForceDecomposition).snap_;
    pdVar2 = (pSVar1->atomData).skippedCharge.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pdVar4 = (pSVar1->atomData).skippedCharge.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
      *pdVar4 = 0.0;
    }
  }
  if ((uVar3 >> 0xc & 1) != 0) {
    pSVar1 = (this->super_ForceDecomposition).snap_;
    std::__fill_a1<OpenMD::Vector3<double>*,OpenMD::Vector3<double>>
              ((pSVar1->atomData).electricField.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (pSVar1->atomData).electricField.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(Vector3<double> *)OpenMD::V3Zero);
    uVar3 = (this->super_ForceDecomposition).atomStorageLayout_;
  }
  if ((uVar3 >> 0x11 & 1) != 0) {
    pSVar1 = (this->super_ForceDecomposition).snap_;
    pdVar2 = (pSVar1->atomData).sitePotential.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pdVar4 = (pSVar1->atomData).sitePotential.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
      *pdVar4 = 0.0;
    }
  }
  return;
}

Assistant:

void ForceMatrixDecomposition::zeroWorkArrays() {
    pairwisePot     = 0.0;
    selfPot         = 0.0;
    excludedPot     = 0.0;
    excludedSelfPot = 0.0;
    selectedPot     = 0.0;
    selectedSelfPot = 0.0;

#ifdef IS_MPI
    if (atomStorageLayout_ & DataStorage::dslForce) {
      fill(atomRowData.force.begin(), atomRowData.force.end(), V3Zero);
      fill(atomColData.force.begin(), atomColData.force.end(), V3Zero);
    }

    if (atomStorageLayout_ & DataStorage::dslTorque) {
      fill(atomRowData.torque.begin(), atomRowData.torque.end(), V3Zero);
      fill(atomColData.torque.begin(), atomColData.torque.end(), V3Zero);
    }

    fill(pot_row.begin(), pot_row.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(pot_col.begin(), pot_col.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(expot_row.begin(), expot_row.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(expot_col.begin(), expot_col.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(selepot_row.begin(), selepot_row.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(selepot_col.begin(), selepot_col.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      fill(atomRowData.particlePot.begin(), atomRowData.particlePot.end(), 0.0);
      fill(atomColData.particlePot.begin(), atomColData.particlePot.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslDensity) {
      fill(atomRowData.density.begin(), atomRowData.density.end(), 0.0);
      fill(atomColData.density.begin(), atomColData.density.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFunctional) {
      fill(atomRowData.functional.begin(), atomRowData.functional.end(), 0.0);
      fill(atomColData.functional.begin(), atomColData.functional.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
      fill(atomRowData.functionalDerivative.begin(),
           atomRowData.functionalDerivative.end(), 0.0);
      fill(atomColData.functionalDerivative.begin(),
           atomColData.functionalDerivative.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      fill(atomRowData.skippedCharge.begin(), atomRowData.skippedCharge.end(),
           0.0);
      fill(atomColData.skippedCharge.begin(), atomColData.skippedCharge.end(),
           0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      fill(atomRowData.flucQFrc.begin(), atomRowData.flucQFrc.end(), 0.0);
      fill(atomColData.flucQFrc.begin(), atomColData.flucQFrc.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      fill(atomRowData.electricField.begin(), atomRowData.electricField.end(),
           V3Zero);
      fill(atomColData.electricField.begin(), atomColData.electricField.end(),
           V3Zero);
    }

    if (atomStorageLayout_ & DataStorage::dslSitePotential) {
      fill(atomRowData.sitePotential.begin(), atomRowData.sitePotential.end(),
           0.0);
      fill(atomColData.sitePotential.begin(), atomColData.sitePotential.end(),
           0.0);
    }

#endif
    // even in parallel, we need to zero out the local arrays:

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      fill(snap_->atomData.particlePot.begin(),
           snap_->atomData.particlePot.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslDensity) {
      fill(snap_->atomData.density.begin(), snap_->atomData.density.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFunctional) {
      fill(snap_->atomData.functional.begin(), snap_->atomData.functional.end(),
           0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
      fill(snap_->atomData.functionalDerivative.begin(),
           snap_->atomData.functionalDerivative.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      fill(snap_->atomData.skippedCharge.begin(),
           snap_->atomData.skippedCharge.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      fill(snap_->atomData.electricField.begin(),
           snap_->atomData.electricField.end(), V3Zero);
    }
    if (atomStorageLayout_ & DataStorage::dslSitePotential) {
      fill(snap_->atomData.sitePotential.begin(),
           snap_->atomData.sitePotential.end(), 0.0);
    }
  }